

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::convert_float_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  CompilerError *this_00;
  float value;
  float fVar4;
  char (*in_stack_fffffffffffffc20) [5];
  string local_390;
  spirv_cross local_370 [32];
  string local_350;
  char *local_330;
  char *comment;
  char print_buffer [32];
  undefined1 local_300 [8];
  SPIRType in_type;
  SPIRType out_type;
  float float_value;
  uint32_t row_local;
  uint32_t col_local;
  SPIRConstant *c_local;
  CompilerGLSL *this_local;
  string *res;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  value = SPIRConstant::scalar_f32(c,col,row);
  uVar2 = ::std::isnan((double)(ulong)(uint)value);
  if (((uVar2 & 1) == 0) && (uVar2 = ::std::isinf((double)(ulong)(uint)value), (uVar2 & 1) == 0)) {
    format_float_abi_cxx11_(&local_390,this,value);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_390);
    ::std::__cxx11::string::~string((string *)&local_390);
    if (((this->backend).float_literal_suffix & 1U) != 0) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"f");
    }
  }
  else {
    bVar1 = is_legacy(this);
    if (bVar1) {
      fVar4 = ::std::numeric_limits<float>::infinity();
      if ((value != fVar4) || (NAN(value) || NAN(fVar4))) {
        fVar4 = ::std::numeric_limits<float>::infinity();
        if ((value != -fVar4) || (NAN(value) || NAN(-fVar4))) {
          uVar2 = ::std::isnan((double)(ulong)(uint)value);
          if ((uVar2 & 1) == 0) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (this_00,"Cannot represent non-finite floating point constant.");
            __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (((this->backend).float_literal_suffix & 1U) == 0) {
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"(0.0 / 0.0)");
          }
          else {
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"(0.0f / 0.0f)");
          }
        }
        else if (((this->backend).float_literal_suffix & 1U) == 0) {
          ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"(-1.0 / 0.0)");
        }
        else {
          ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"(-1.0f / 0.0f)");
        }
      }
      else if (((this->backend).float_literal_suffix & 1U) == 0) {
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"(1.0 / 0.0)");
      }
      else {
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"(1.0f / 0.0f)");
      }
    }
    else {
      SPIRType::SPIRType((SPIRType *)&in_type.member_name_cache._M_h._M_single_bucket,OpTypeFloat);
      SPIRType::SPIRType((SPIRType *)local_300,OpTypeInt);
      in_type.super_IVariant.self.id = 8;
      in_type.basetype = Void;
      in_type.super_IVariant._12_4_ = 0x20;
      uVar3 = SPIRConstant::scalar(c,col,row);
      snprintf((char *)&comment,0x20,"0x%xu",(ulong)uVar3);
      local_330 = "inf";
      fVar4 = ::std::numeric_limits<float>::infinity();
      if ((value != -fVar4) || (NAN(value) || NAN(-fVar4))) {
        uVar2 = ::std::isnan((double)(ulong)(uint)value);
        if ((uVar2 & 1) != 0) {
          local_330 = "nan";
        }
      }
      else {
        local_330 = "-inf";
      }
      (*(this->super_Compiler)._vptr_Compiler[0x3c])
                (local_370,this,&in_type.member_name_cache._M_h._M_single_bucket,local_300);
      join<std::__cxx11::string,char_const(&)[2],char(&)[32],char_const(&)[5],char_const*&,char_const(&)[5]>
                (&local_350,local_370,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5ac375,
                 (char (*) [2])&comment,(char (*) [32])" /* ",(char (*) [5])&local_330,
                 (char **)" */)",in_stack_fffffffffffffc20);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_350);
      ::std::__cxx11::string::~string((string *)&local_350);
      ::std::__cxx11::string::~string((string *)local_370);
      SPIRType::~SPIRType((SPIRType *)local_300);
      SPIRType::~SPIRType((SPIRType *)&in_type.member_name_cache._M_h._M_single_bucket);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_float_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	float float_value = c.scalar_f32(col, row);

	if (std::isnan(float_value) || std::isinf(float_value))
	{
		// Use special representation.
		if (!is_legacy())
		{
			SPIRType out_type { OpTypeFloat };
			SPIRType in_type { OpTypeInt };
			out_type.basetype = SPIRType::Float;
			in_type.basetype = SPIRType::UInt;
			out_type.vecsize = 1;
			in_type.vecsize = 1;
			out_type.width = 32;
			in_type.width = 32;

			char print_buffer[32];
#ifdef _WIN32
			sprintf(print_buffer, "0x%xu", c.scalar(col, row));
#else
			snprintf(print_buffer, sizeof(print_buffer), "0x%xu", c.scalar(col, row));
#endif

			const char *comment = "inf";
			if (float_value == -numeric_limits<float>::infinity())
				comment = "-inf";
			else if (std::isnan(float_value))
				comment = "nan";
			res = join(bitcast_glsl_op(out_type, in_type), "(", print_buffer, " /* ", comment, " */)");
		}
		else
		{
			if (float_value == numeric_limits<float>::infinity())
			{
				if (backend.float_literal_suffix)
					res = "(1.0f / 0.0f)";
				else
					res = "(1.0 / 0.0)";
			}
			else if (float_value == -numeric_limits<float>::infinity())
			{
				if (backend.float_literal_suffix)
					res = "(-1.0f / 0.0f)";
				else
					res = "(-1.0 / 0.0)";
			}
			else if (std::isnan(float_value))
			{
				if (backend.float_literal_suffix)
					res = "(0.0f / 0.0f)";
				else
					res = "(0.0 / 0.0)";
			}
			else
				SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
		}
	}
	else
	{
		res = format_float(float_value);
		if (backend.float_literal_suffix)
			res += "f";
	}

	return res;
}